

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_variant.h
# Opt level: O1

bool __thiscall BamTools::Variant::is_type<float>(Variant *this)

{
  char *__s1;
  int iVar1;
  bool bVar2;
  
  if (this->data != (ImplBase *)0x0) {
    __s1 = *(char **)(this->data->_vptr_ImplBase[-1] + 8);
    if (__s1 == "N8BamTools7Variant4ImplIfEE") {
      bVar2 = true;
    }
    else if (*__s1 == '*') {
      bVar2 = false;
    }
    else {
      iVar1 = strcmp(__s1,"N8BamTools7Variant4ImplIfEE");
      bVar2 = iVar1 == 0;
    }
    return bVar2;
  }
  __cxa_bad_typeid();
}

Assistant:

bool is_type() const
    {
        return typeid(*data) == typeid(Impl<T>);
    }